

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFunction.cpp
# Opt level: O1

float __thiscall nanoNet::ActivationFunction::operator()(ActivationFunction *this,float x)

{
  float fVar1;
  
  switch(this->m_option) {
  default:
    fVar1 = expf(-x);
    x = 1.0 / (fVar1 + 1.0);
    break;
  case Tanh:
    fVar1 = expf(-x);
    x = 2.0 / (fVar1 + 1.0) + -1.0;
    break;
  case Relu:
    if (x <= 0.0) {
      x = 0.0;
    }
    break;
  case Linear:
    break;
  }
  return x;
}

Assistant:

float ActivationFunction::operator()(float x) const
{
    switch (m_option)
    {
    case Sigmoid:
        return sigmoid_activation(x);
    case Tanh:
        return tanh_activation(x);
    case Relu:
        return relu_activation(x);
    case Linear:
        return linear_activation(x);
    default:
        return sigmoid_activation(x);
    }
}